

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_ext(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg;
  uint uVar1;
  TCGv_i32 ret;
  TCGv_i32 tmp;
  TCGv_i32 reg;
  int op;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  arg = tcg_ctx_00->cpu_dregs[(int)(insn & 7)];
  uVar1 = (int)(uint)insn >> 6 & 7;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  if (uVar1 == 3) {
    tcg_gen_ext16s_i32_m68k(tcg_ctx_00,ret,arg);
  }
  else {
    tcg_gen_ext8s_i32_m68k(tcg_ctx_00,ret,arg);
  }
  if (uVar1 == 2) {
    gen_partset_reg(tcg_ctx_00,1,arg,ret);
  }
  else {
    tcg_gen_mov_i32(tcg_ctx_00,arg,ret);
  }
  gen_logic_cc(s,ret,2);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

DISAS_INSN(ext)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int op;
    TCGv reg;
    TCGv tmp;

    reg = DREG(insn, 0);
    op = (insn >> 6) & 7;
    tmp = tcg_temp_new(tcg_ctx);
    if (op == 3)
        tcg_gen_ext16s_i32(tcg_ctx, tmp, reg);
    else
        tcg_gen_ext8s_i32(tcg_ctx, tmp, reg);
    if (op == 2)
        gen_partset_reg(tcg_ctx, OS_WORD, reg, tmp);
    else
        tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    gen_logic_cc(s, tmp, OS_LONG);
    tcg_temp_free(tcg_ctx, tmp);
}